

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printmetrics.h
# Opt level: O3

bool MetricsDiscovery::printMetricsHelper(bool devicesOnly)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  uint *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  code *pcVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  char *pcVar10;
  string check;
  IMetricsDeviceLatest *local_60;
  IMetricsDeviceLatest *local_58;
  undefined8 local_50;
  undefined7 local_48;
  undefined4 uStack_41;
  undefined1 local_3d;
  long local_38;
  
  lVar3 = dlopen("libigdmd.so",1);
  if (lVar3 == 0) {
    local_48 = 0x6d64676962696c;
    uStack_41 = 0x6f732e64;
    local_50 = 0xb;
    local_3d = 0;
    local_58 = (IMetricsDeviceLatest *)&local_48;
    std::__cxx11::string::append((char *)&local_58);
    lVar3 = dlopen(local_58,1);
    if (local_58 != (IMetricsDeviceLatest *)&local_48) {
      operator_delete(local_58);
    }
    if ((lVar3 == 0) && (lVar3 = dlopen("libmd.so",1), lVar3 == 0)) {
      printMetricsHelper();
      uVar8 = extraout_RAX_00;
      goto LAB_00106a32;
    }
  }
  pcVar4 = (code *)dlsym(lVar3,"OpenAdapterGroup");
  local_38 = lVar3;
  if (pcVar4 == (code *)0x0) {
    printMetricsHelper();
    uVar8 = extraout_RAX_01;
LAB_00106bd1:
    bVar1 = false;
  }
  else {
    local_58 = (IMetricsDeviceLatest *)0x0;
    uVar2 = (*pcVar4)();
    if (uVar2 == 0) {
      puVar5 = (uint *)(**(code **)(*(long *)local_58 + 0x10))();
      if (puVar5 == (uint *)0x0) {
        printMetricsHelper();
        uVar8 = extraout_RAX_02;
        goto LAB_00106bd1;
      }
      printf("MDAPI Headers: v%d.%d.%d, MDAPI Lib: v%d.%d.%d\n",1,0xc,0xaa,(ulong)*puVar5,
             (ulong)puVar5[1],puVar5[2]);
      if (*puVar5 == 1) {
        if (puVar5[1] == 0) goto LAB_00106a4c;
LAB_0010687b:
        pcVar10 = "";
        if (1 < puVar5[3]) {
          pcVar10 = "s";
        }
        printf("Found %u MDAPI Adapter%s:\n",(ulong)puVar5[3],pcVar10);
        if (puVar5[3] != 0) {
          uVar2 = 0;
          do {
            plVar6 = (long *)(**(code **)(*(long *)local_58 + 0x18))(local_58,uVar2);
            if (plVar6 == (long *)0x0) {
              printMetricsHelper();
            }
            else {
              puVar7 = (undefined8 *)(**(code **)(*plVar6 + 0x10))(plVar6);
              if (puVar7 == (undefined8 *)0x0) {
                printMetricsHelper();
              }
              else {
                pcVar10 = "Unknown";
                if ((ulong)*(uint *)(puVar7 + 6) < 3) {
                  pcVar10 = (&PTR_anon_var_dwarf_5144_00119da8)[*(uint *)(puVar7 + 6)];
                }
                printf("Adapter %u: %s (%s)\n",(ulong)uVar2,*puVar7,pcVar10);
                printf("\tPCI Vendor Id: %04X, Device Id: %04X, Bus Info: %02X:%02X.%02X\n",
                       (ulong)*(uint *)((long)puVar7 + 0x14),(ulong)*(uint *)((long)puVar7 + 0x1c),
                       (ulong)*(uint *)((long)puVar7 + 0x24),(ulong)*(uint *)(puVar7 + 5),
                       (ulong)*(uint *)((long)puVar7 + 0x2c));
              }
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 < puVar5[3]);
          if (puVar5[3] != 0 && !devicesOnly) {
            uVar8 = 0;
            do {
              plVar6 = (long *)(**(code **)(*(long *)local_58 + 0x18))(local_58,uVar8);
              if (plVar6 == (long *)0x0) {
                printMetricsHelper();
              }
              else {
                puVar7 = (undefined8 *)(**(code **)(*plVar6 + 0x10))(plVar6);
                if (puVar7 == (undefined8 *)0x0) {
                  printMetricsHelper();
                }
                else {
                  pcVar10 = "Unknown";
                  if ((ulong)*(uint *)(puVar7 + 6) < 3) {
                    pcVar10 = (&PTR_anon_var_dwarf_5144_00119da8)[*(uint *)(puVar7 + 6)];
                  }
                  printf("\nAdapter %u: %s (%s)\n",uVar8,*puVar7,pcVar10);
                  printf("\tPCI Vendor Id: %04X, Device Id: %04X, Bus Info: %02X:%02X.%02X\n",
                         (ulong)*(uint *)((long)puVar7 + 0x14),(ulong)*(uint *)((long)puVar7 + 0x1c)
                         ,(ulong)*(uint *)((long)puVar7 + 0x24),(ulong)*(uint *)(puVar7 + 5),
                         (ulong)*(uint *)((long)puVar7 + 0x2c));
                  puts("########################################\n");
                  local_60 = (IMetricsDeviceLatest *)0x0;
                  uVar2 = (**(code **)(*plVar6 + 0x80))(plVar6,&local_60);
                  if (uVar2 == 0) {
                    printMetricsForDevice(local_60);
                    uVar2 = (**(code **)(*plVar6 + 0x30))(plVar6,local_60);
                    if (uVar2 == 0) goto LAB_00106b28;
                    pcVar10 = "CloseMetricsDevice failed, res: %d\n";
                  }
                  else {
                    pcVar10 = "OpenMetricsDevice failed, res: %d, skipping adapter.\n";
                  }
                  fprintf(_stderr,pcVar10,(ulong)uVar2);
                }
              }
LAB_00106b28:
              uVar2 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar2;
            } while (uVar2 < puVar5[3]);
          }
        }
      }
      else {
        if (*puVar5 != 0) goto LAB_0010687b;
LAB_00106a4c:
        printMetricsHelper();
      }
      uVar8 = (**(code **)(*(long *)local_58 + 0x20))();
      bVar1 = true;
      uVar2 = (uint)uVar8;
      if (uVar2 == 0) goto LAB_0010696f;
      pcVar10 = "AdapterGroup->Close() failed, res: %d\n";
    }
    else {
      pcVar10 = "OpenAdapterGroup failed, res: %d\n";
      bVar1 = false;
    }
    uVar2 = fprintf(_stderr,pcVar10,(ulong)uVar2);
    uVar8 = (ulong)uVar2;
  }
LAB_0010696f:
  lVar3 = local_38;
  if (!bVar1 && !devicesOnly) {
    pcVar4 = (code *)dlsym(local_38,"OpenMetricsDevice");
    if (pcVar4 == (code *)0x0) {
      printMetricsHelper();
      uVar8 = extraout_RAX_03;
    }
    else {
      pcVar9 = (code *)dlsym(lVar3,"CloseMetricsDevice");
      if (pcVar9 == (code *)0x0) {
        printMetricsHelper();
        uVar8 = extraout_RAX_04;
      }
      else {
        uVar2 = (*pcVar4)(&local_58);
        if (uVar2 == 0) {
          puVar5 = (uint *)(**(code **)(*(long *)local_58 + 0x10))();
          if (puVar5 == (uint *)0x0) {
            printMetricsHelper();
            uVar8 = extraout_RAX_05;
            goto LAB_00106a32;
          }
          printf("MDAPI Headers: v%d.%d.%d, MDAPI Lib: v%d.%d.%d\n",1,0xc,0xaa,(ulong)*puVar5,
                 (ulong)puVar5[1],puVar5[2]);
          uVar2 = *puVar5;
          if (uVar2 == 1) {
            uVar2 = puVar5[1];
          }
          if (uVar2 == 0) {
            printMetricsHelper();
            uVar8 = extraout_RAX;
            goto LAB_00106a32;
          }
          printMetricsForDevice(local_58);
          uVar8 = (*pcVar9)(local_58);
          uVar2 = (uint)uVar8;
          if (uVar2 == 0) goto LAB_00106a32;
          pcVar10 = "CloseMetricsDevice failed, res: %d\n";
        }
        else {
          pcVar10 = "OpenMetricsDevice failed, res: %d\n";
        }
        uVar2 = fprintf(_stderr,pcVar10,(ulong)uVar2);
        uVar8 = (ulong)uVar2;
      }
    }
  }
LAB_00106a32:
  return SUB81(uVar8,0);
}

Assistant:

static bool printMetricsHelper(bool devicesOnly)
{
    void* pLibrary = OpenLibrary();
    if (pLibrary == NULL)
    {
        fprintf(stderr, "Couldn't load metrics discovery library!\n");
        return false;
    }

    bool success = printMetricsForAdapterGroup(pLibrary, devicesOnly);
    if (!success && !devicesOnly)
    {
        success = printMetricsForLegacyDevice(pLibrary);
    }

    return success;
}